

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::GroupInfo::GroupInfo(GroupInfo *this,string *_name,size_t _groupIndex,size_t _groupsCount)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + _name->_M_string_length);
  this->groupIndex = _groupIndex;
  this->groupsCounts = _groupsCount;
  return;
}

Assistant:

GroupInfo::GroupInfo(std::string const &_name, std::size_t _groupIndex, std::size_t _groupsCount)
      : name(_name)
      , groupIndex(_groupIndex)
      , groupsCounts(_groupsCount) {
  }